

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.c
# Opt level: O2

int showmatch(int f,int n)

{
  char *pcVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  line *plVar5;
  long lVar6;
  mgwin *pmVar7;
  int iVar8;
  long lVar9;
  line *plVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  line *plVar16;
  ulong uVar17;
  int iVar18;
  int *piVar19;
  byte local_138 [256];
  int local_38;
  int local_34;
  
  if (n < 1) {
    n = 0;
  }
  iVar18 = 0;
  local_34 = n;
LAB_00112f7c:
  iVar8 = 1;
  if ((iVar18 == n) || (iVar8 = selfinsert(8,1), pmVar7 = curwp, iVar8 != 1)) {
    return iVar8;
  }
  sVar3 = key.k_chars[(long)key.k_count + -1];
  lVar9 = -1;
  do {
    uVar13 = (int)sVar3;
    if (lVar9 == 3) goto LAB_00112fcb;
    lVar6 = lVar9 + 1;
    lVar9 = lVar9 + 1;
  } while (sVar3 != bal[lVar6].right);
  uVar13 = (int)bal[lVar9].left;
LAB_00112fcb:
  plVar5 = curwp->w_dotp;
  iVar8 = curwp->w_doto;
  uVar12 = (ulong)(iVar8 - 1);
  iVar14 = 0;
  plVar16 = plVar5;
  do {
    local_38 = iVar18;
    if ((int)uVar12 == 0) {
      plVar16 = plVar16->l_bp;
      if (plVar16 == curbp->b_headp) {
        dobeep();
        goto LAB_00113196;
      }
      piVar19 = &plVar16->l_used;
      uVar11 = (ulong)(uint)plVar16->l_used;
LAB_0011302f:
      uVar12 = uVar11;
      uVar15 = (uint)*curbp->b_nlchr;
      uVar11 = uVar12;
    }
    else {
      piVar19 = &plVar16->l_used;
      uVar4 = plVar16->l_used;
      uVar12 = (long)(int)uVar12 - 1;
      uVar11 = (ulong)uVar4;
      if ((uint)uVar12 == uVar4) goto LAB_0011302f;
      uVar15 = (uint)(byte)plVar16->l_text[uVar12];
    }
    if (uVar15 == uVar13) {
      if (iVar14 == 0) break;
      iVar14 = iVar14 + -1;
    }
    iVar14 = iVar14 + (uint)(uVar15 == (int)sVar3);
  } while( true );
  plVar10 = (line *)&curwp->w_linep;
  iVar18 = 0;
  while (plVar10 = plVar10->l_fp, plVar10 != plVar5->l_fp) {
    if (plVar10 == plVar16) {
      iVar18 = 1;
    }
  }
  if (iVar18 == 1) {
    curwp->w_dotp = plVar16;
    pmVar7->w_doto = (int)uVar12;
    pcVar1 = &pmVar7->w_rflag;
    *pcVar1 = *pcVar1 | 2;
    update(2);
    ttwait(1000);
    pmVar7 = curwp;
    curwp->w_dotp = plVar5;
    pmVar7->w_doto = iVar8;
    pcVar1 = &pmVar7->w_rflag;
    *pcVar1 = *pcVar1 | 2;
    update(2);
  }
  else {
    lVar9 = 0;
    uVar12 = 0;
    while( true ) {
      uVar13 = (uint)uVar12;
      uVar17 = (ulong)(int)uVar13;
      if (((int)uVar11 <= lVar9) || (0xfe < uVar13)) break;
      bVar2 = plVar16->l_text[lVar9];
      if ((ulong)bVar2 == 9) {
        iVar18 = ntabstop(uVar13,curbp->b_tabw);
        for (; (uVar12 = uVar17, (long)uVar17 < (long)iVar18 && (uVar17 < 0xff));
            uVar17 = uVar17 + 1) {
          local_138[uVar17] = 0x20;
        }
      }
      else if ((cinfo[bVar2] & 8U) == 0) {
        uVar12 = (ulong)(uVar13 + 1);
        local_138[uVar17] = bVar2;
      }
      else {
        if (0xfc < uVar13) break;
        uVar11 = uVar12 & 0xffffffff;
        local_138[uVar17] = 0x5e;
        uVar12 = (ulong)(uVar13 + 2);
        local_138[uVar11 + 1] = bVar2 ^ 0x40;
      }
      lVar9 = lVar9 + 1;
      uVar11 = (ulong)(uint)*piVar19;
    }
    local_138[uVar17] = 0;
    ewprintf("Matches %s",local_138);
    n = local_34;
  }
LAB_00113196:
  iVar18 = local_38 + 1;
  goto LAB_00112f7c;
}

Assistant:

int
showmatch(int f, int n)
{
	int	i, s;

	for (i = 0; i < n; i++) {
		if ((s = selfinsert(FFRAND, 1)) != TRUE)
			return (s);
		/* unbalanced -- warn user */
		if (balance() != TRUE)
			dobeep();
	}
	return (TRUE);
}